

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O2

_Bool al_register_sample_loader(char *ext,_func_ALLEGRO_SAMPLE_ptr_char_ptr *loader)

{
  _Bool _Var1;
  size_t sVar2;
  ACODEC_TABLE *pAVar3;
  
  sVar2 = strlen(ext);
  if (sVar2 - 0x1f < 0xffffffffffffffe0) {
LAB_00106fa5:
    _Var1 = false;
  }
  else {
    pAVar3 = find_acodec_table_entry(ext);
    if (loader == (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0) {
      if ((pAVar3 == (ACODEC_TABLE *)0x0) ||
         (pAVar3->loader == (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0)) goto LAB_00106fa5;
    }
    else if (pAVar3 == (ACODEC_TABLE *)0x0) {
      pAVar3 = add_acodec_table_entry(ext);
    }
    pAVar3->loader = loader;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool al_register_sample_loader(const char *ext,
   ALLEGRO_SAMPLE *(*loader)(const char *filename))
{
   ACODEC_TABLE *ent;

   if (strlen(ext) + 1 >= MAX_EXTENSION_LENGTH) {
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (!loader) {
      if (!ent || !ent->loader) {
         return false; /* Nothing to remove. */
      }
   }
   else if (!ent) {
      ent = add_acodec_table_entry(ext);
   }

   ent->loader = loader;

   return true;
}